

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode JsTTDRawBufferAsyncModifyComplete(byte *finalModPos)

{
  ScriptContext *scriptContext;
  JsErrorCode exitStatus;
  JsrtContext *pJVar1;
  ArrayBuffer *ref;
  void *unaff_retaddr;
  undefined1 auStack_b8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  TTDPendingAsyncBufferModification pendingAsyncInfo;
  TTDRecorder _actionEntryPopper;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pendingAsyncInfo.Index = 0;
  pendingAsyncInfo._12_4_ = 0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  pJVar1 = JsrtContext::GetCurrent();
  if (pJVar1 == (JsrtContext *)0x0) {
    exitStatus = JsErrorNoCurrentContext;
    ref = (ArrayBuffer *)0x0;
  }
  else {
    scriptContext =
         (((pJVar1->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)((long)&_actionEntryPopper.m_resultPtr + 4),
               ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
    __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
    __entryExitRecord.scriptContext = (ScriptContext *)0x0;
    __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
    __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
    __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
    auStack_b8 = (undefined1  [8])0x0;
    __entryExitRecord._0_1_ = 0;
    __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
    __entryExitRecord._2_6_ = 0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
               (ScriptEntryExitRecord *)auStack_b8,unaff_retaddr,&stack0x00000000,true,true,true);
    Js::ScriptContext::OnScriptStart(scriptContext,true,true);
    Js::EnterScriptObject::VerifyEnterScript
              ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
    exitStatus = JsNoError;
    if (scriptContext->TTDRecordModeEnabled == true) {
      __enterScriptObject.library = (JavascriptLibrary *)0x0;
      pendingAsyncInfo.ArrayBufferVar = (Var)0x0;
      TTD::ScriptContextTTD::GetFromAsyncPendingList
                (scriptContext->TTDContextInfo,
                 (TTDPendingAsyncBufferModification *)&__enterScriptObject.library,finalModPos);
      ref = Js::VarTo<Js::ArrayBuffer>(__enterScriptObject.library);
      if (scriptContext->TTDShouldPerformRecordAction == true) {
        TTD::EventLog::RecordJsRTRawBufferAsyncModifyComplete
                  (scriptContext->threadContext->TTDLog,
                   (TTDJsRTActionResultAutoRecorder *)&pendingAsyncInfo.Index,
                   (TTDPendingAsyncBufferModification *)&__enterScriptObject.library,finalModPos);
      }
    }
    else {
      ref = (ArrayBuffer *)0x0;
    }
    Js::EnterScriptObject::~EnterScriptObject
              ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
              ((AutoNestedHandledExceptionType *)((long)&_actionEntryPopper.m_resultPtr + 4));
  }
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)&pendingAsyncInfo.Index,exitStatus);
  if (exitStatus == JsNoError) {
    if (ref == (ArrayBuffer *)0x0) {
      exitStatus = JsNoError;
    }
    else {
      exitStatus = JsRelease(ref,(uint *)0x0);
    }
  }
  return exitStatus;
}

Assistant:

CHAKRA_API JsTTDRawBufferAsyncModifyComplete(_In_ byte* finalModPos)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    JsValueRef releaseObj = nullptr;
    JsErrorCode releaseStatus = ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        if (scriptContext->IsTTDRecordModeEnabled())
        {
            TTD::TTDPendingAsyncBufferModification pendingAsyncInfo = { 0 };
            scriptContext->TTDContextInfo->GetFromAsyncPendingList(&pendingAsyncInfo, finalModPos);

            Js::ArrayBuffer* dstBuff = Js::VarTo<Js::ArrayBuffer>(pendingAsyncInfo.ArrayBufferVar);
            releaseObj = dstBuff;

            PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTRawBufferAsyncModifyComplete, pendingAsyncInfo, finalModPos);
        }

        return JsNoError;
    });

    if(releaseStatus != JsNoError)
    {
        return releaseStatus;
    }

    //We need to root release ref so we can free this in replay if needed!!!
    if(releaseObj == nullptr)
    {
        return JsNoError;
    }
    else
    {
        return JsRelease(releaseObj, nullptr);
    }

#endif
}